

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_exporter.cpp
# Opt level: O1

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> make_alf_file(fitting_result *data)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  ltc_store_data *plVar4;
  pointer *__ptr;
  uint uVar5;
  fitting_result *in_RSI;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint roughness;
  
  puVar3 = (undefined8 *)operator_new(0x40);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  *(undefined8 **)data = puVar3;
  *(undefined4 *)puVar3 = 0x464c41;
  uVar5 = in_RSI->num_samples_angle;
  *(uint *)(puVar3 + 1) = uVar5;
  uVar6 = in_RSI->num_samples_roughness;
  *(uint *)((long)puVar3 + 0xc) = uVar6;
  *(undefined4 *)((long)puVar3 + 4) = 1;
  iVar8 = uVar6 * uVar5;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(puVar3 + 2),(ulong)(uint)(iVar8 * 4));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(*(long *)data + 0x28),
             (ulong)(uint)(iVar8 * 3));
  if (*(int *)(*(long *)data + 8) != 0) {
    uVar5 = 0;
    do {
      uVar6 = *(uint *)(*(long *)data + 0xc);
      if (uVar6 != 0) {
        roughness = 0;
        do {
          plVar4 = fitting_result::getData(in_RSI,uVar5,roughness);
          iVar8 = uVar6 * uVar5 + roughness;
          uVar7 = (ulong)(uint)(iVar8 * 4);
          lVar1 = *(long *)data;
          lVar2 = *(long *)(lVar1 + 0x10);
          *(float *)(lVar2 + uVar7 * 4) = (plVar4->matrix_parameters)._M_elems[0];
          *(float *)(lVar2 + 4 + uVar7 * 4) = (plVar4->matrix_parameters)._M_elems[1];
          *(float *)(lVar2 + 8 + uVar7 * 4) = (plVar4->matrix_parameters)._M_elems[2];
          *(float *)(lVar2 + 0xc + uVar7 * 4) = (plVar4->matrix_parameters)._M_elems[3];
          lVar1 = *(long *)(lVar1 + 0x28);
          *(float *)(lVar1 + (ulong)(uint)(iVar8 * 3) * 4) = (plVar4->matrix_parameters)._M_elems[4]
          ;
          *(float *)(lVar1 + (ulong)(iVar8 * 3 + 1) * 4) = plVar4->distribution_norm;
          *(float *)(lVar1 + (ulong)(iVar8 * 3 + 2) * 4) = plVar4->fresnel_term;
          roughness = roughness + 1;
          uVar6 = *(uint *)(*(long *)data + 0xc);
        } while (roughness < uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)(*(long *)data + 8));
  }
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)data;
}

Assistant:

std::unique_ptr<alf::alf_file> make_alf_file(const fitting_result &data)
{
  auto file = std::make_unique<alf::alf_file>();

  std::strcpy(file->header.id, "ALF");
  file->header.num_samples_angle = data.num_samples_angle;
  file->header.num_samples_roughness = data.num_samples_roughness;
  file->header.version_major = 1;
  file->header.version_minor = 0;

  auto num_samples = file->header.num_samples_angle * file->header.num_samples_roughness;
  file->texture_slot1.resize(4 * num_samples);
  file->texture_slot2.resize(3 * num_samples);

  for (auto theta = 0; theta < file->header.num_samples_angle; ++theta)
  {
    for (auto alpha = 0; alpha < file->header.num_samples_roughness; ++alpha)
    {
      auto matrix_index = file->header.num_samples_roughness * theta + alpha;
      auto base_tex1 = 4 * matrix_index;
      auto base_tex2 = 3 * matrix_index;

      const auto& params = data.getData(theta, alpha);

      file->texture_slot1[base_tex1+0] = params.matrix_parameters[0];
      file->texture_slot1[base_tex1+1] = params.matrix_parameters[1];
      file->texture_slot1[base_tex1+2] = params.matrix_parameters[2];
      file->texture_slot1[base_tex1+3] = params.matrix_parameters[3];

      file->texture_slot2[base_tex2+0] = params.matrix_parameters[4];
      file->texture_slot2[base_tex2+1] = params.distribution_norm;
      file->texture_slot2[base_tex2+2] = params.fresnel_term;
    }
  }

  return file;
}